

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_object_hasOwnProperty(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  JSAtom prop;
  int iVar2;
  JSValue JVar3;
  
  prop = JS_ValueToAtom(ctx,*argv);
  if (prop != 0) {
    JVar3 = JS_ToObject(ctx,this_val);
    JVar3.u = JVar3.u;
    if ((uint)JVar3.tag == 6) {
      JS_FreeAtom(ctx,prop);
      return JVar3;
    }
    iVar2 = JS_GetOwnPropertyInternal(ctx,(JSPropertyDescriptor *)0x0,(JSObject *)JVar3.u.ptr,prop);
    JS_FreeAtom(ctx,prop);
    if ((0xfffffff4 < (uint)JVar3.tag) &&
       (iVar1 = *JVar3.u.ptr, *(int *)JVar3.u.ptr = iVar1 + -1, iVar1 < 2)) {
      __JS_FreeValueRT(ctx->rt,JVar3);
    }
    if (-1 < iVar2) {
      JVar3.u._1_7_ = 0;
      JVar3.u.int32._0_1_ = iVar2 != 0;
      JVar3.tag = 1;
      return JVar3;
    }
  }
  return (JSValue)(ZEXT816(6) << 0x40);
}

Assistant:

static JSValue js_object_hasOwnProperty(JSContext *ctx, JSValueConst this_val,
                                        int argc, JSValueConst *argv)
{
    JSValue obj;
    JSAtom atom;
    JSObject *p;
    BOOL ret;

    atom = JS_ValueToAtom(ctx, argv[0]); /* must be done first */
    if (unlikely(atom == JS_ATOM_NULL))
        return JS_EXCEPTION;
    obj = JS_ToObject(ctx, this_val);
    if (JS_IsException(obj)) {
        JS_FreeAtom(ctx, atom);
        return obj;
    }
    p = JS_VALUE_GET_OBJ(obj);
    ret = JS_GetOwnPropertyInternal(ctx, NULL, p, atom);
    JS_FreeAtom(ctx, atom);
    JS_FreeValue(ctx, obj);
    if (ret < 0)
        return JS_EXCEPTION;
    else
        return JS_NewBool(ctx, ret);
}